

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-file.cc
# Opt level: O2

void __thiscall PcapFile::HandleFragment(PcapFile *this,shared_ptr<Ipv4Packet> *ipv4p,istream *is)

{
  pointer psVar1;
  Ipv4Fragment *this_00;
  element_type *this_01;
  bool bVar2;
  uint8_t uVar3;
  pointer psVar4;
  ostream *poVar5;
  pointer psVar6;
  const_iterator __position;
  shared_ptr<Ipv4Fragment> frag;
  shared_ptr<EigrpPacket> eigrpp;
  __shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2> local_1f8;
  __shared_ptr<Packet,(__gnu_cxx::_Lock_policy)2> local_1e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  __shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2> local_1d8;
  __shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2> local_1c8;
  stringstream ss;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b0 [48];
  
  psVar1 = (this->fragments).
           super__Vector_base<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar4 = psVar1;
  for (psVar6 = (this->fragments).
                super__Vector_base<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
                ._M_impl.super__Vector_impl_data._M_start; __position._M_current = psVar1,
      psVar6 != psVar4; psVar6 = psVar6 + 1) {
    this_00 = (psVar6->super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1c8,&ipv4p->super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>);
    bVar2 = Ipv4Fragment::IsSameIpPacket(this_00,(shared_ptr<Ipv4Packet> *)&local_1c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c8._M_refcount);
    psVar4 = (this->fragments).
             super__Vector_base<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __position._M_current = psVar6;
    if (bVar2) break;
  }
  if (__position._M_current == psVar4) {
    std::make_shared<Ipv4Fragment,std::shared_ptr<Ipv4Packet>&>((shared_ptr<Ipv4Packet> *)&ss);
    std::vector<std::shared_ptr<Ipv4Fragment>,std::allocator<std::shared_ptr<Ipv4Fragment>>>::
    emplace_back<std::shared_ptr<Ipv4Fragment>>
              ((vector<std::shared_ptr<Ipv4Fragment>,std::allocator<std::shared_ptr<Ipv4Fragment>>>
                *)&this->fragments,(shared_ptr<Ipv4Fragment> *)&ss);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1b0);
    __position._M_current =
         (this->fragments).
         super__Vector_base<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
  }
  std::__shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&frag.super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>,
             &(__position._M_current)->super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>)
  ;
  this_01 = frag.super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1d8,&ipv4p->super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>);
  Ipv4Fragment::Add(this_01,(shared_ptr<Ipv4Packet> *)&local_1d8,is);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d8._M_refcount);
  bVar2 = Ipv4Fragment::IsComplete
                    (frag.super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (bVar2) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    Ipv4Fragment::get_data
              (frag.super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&ss);
    uVar3 = Ipv4Fragment::get_protocol
                      (frag.super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (uVar3 == 'X') {
      Ipv4Fragment::get_tlen
                (frag.super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      std::make_shared<EigrpPacket,std::__cxx11::stringstream&,unsigned_short>
                ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&eigrpp,
                 (unsigned_short *)&ss);
      std::__shared_ptr<Packet,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<EigrpPacket,void>
                (local_1e8,&eigrpp.super___shared_ptr<EigrpPacket,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_1f8,&frag.super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>);
      InsertL4Packet(this,(shared_ptr<Packet> *)local_1e8,(shared_ptr<Ipv4Fragment> *)&local_1f8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f8._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&eigrpp.super___shared_ptr<EigrpPacket,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"unknow protocol: ");
      uVar3 = Ipv4Fragment::get_protocol
                        (frag.super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      poVar5 = std::operator<<(poVar5,uVar3);
      std::operator<<(poVar5,'\n');
    }
    std::vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>::
    erase(&this->fragments,__position);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&frag.super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void PcapFile::HandleFragment(std::shared_ptr<Ipv4Packet> ipv4p, std::istream& is)
{
    auto temp_iter = fragments.end();
    for (auto iter = fragments.begin(); iter != fragments.end(); ++iter)
    {
        if ((*iter)->IsSameIpPacket(ipv4p))
        {
            temp_iter = iter;
            break;
        }
    }

    if (temp_iter == fragments.end())
    {
        fragments.push_back(std::make_shared<Ipv4Fragment>(ipv4p));
        temp_iter = fragments.end() - 1;
    }

    auto frag = *temp_iter;
    frag->Add(ipv4p, is);

    if (frag->IsComplete())
    {
        //将完整的ip包数据提取出来
        std::stringstream ss;
        frag->get_data(ss);
        if (frag->get_protocol() == 88)  // eigrp
        {
            auto eigrpp = std::make_shared<EigrpPacket>(ss, frag->get_tlen());
            InsertL4Packet(eigrpp, frag);
        }
        else
        {
            std::cout << "unknow protocol: " << frag->get_protocol() << '\n';
        }
        //将用完的fragment删掉，节省空间和时间
        fragments.erase(temp_iter);
    }
}